

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsay.c
# Opt level: O1

void speak_stdin_console(OpenJTalk *openjtalk)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  char line [1001];
  char local_418 [1016];
  
  bVar5 = true;
  do {
    pcVar3 = fgets(local_418,0x104,_stdin);
    pcVar4 = local_418;
    if (pcVar3 == (char *)0x0) {
      return;
    }
LAB_001019d7:
    for (; cVar1 = *pcVar4, cVar1 != '\0'; pcVar4 = pcVar4 + 1) {
      if ((cVar1 == '\n') || (cVar1 == '\r')) {
        *pcVar4 = '\0';
        break;
      }
    }
    if (local_418[0] != '\0') {
      openjtalk_speakSync(openjtalk,local_418);
      pcVar3 = fgets(local_418,0x104,_stdin);
      pcVar4 = local_418;
      if (pcVar3 == (char *)0x0) {
        return;
      }
      goto LAB_001019d7;
    }
    bVar2 = !bVar5;
    bVar5 = false;
    if (bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void speak_stdin_console(OpenJTalk *openjtalk)
{
	char line[MAX_LENGTH + 1];
	int empty = 0;

	while (fgets(line, MAX_PATH, stdin) != NULL)
	{
		remove_cr_lf(line);
		if (strlen(line) == 0)
		{
			empty++;
			if (empty == 2)
			{
				break;
			}
			continue;
		}
#if defined(_WIN32)
		openjtalk_speakSyncSjis(openjtalk, line);
#else
		openjtalk_speakSync(openjtalk, line);
#endif
	}
}